

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

LPCWSTR __thiscall
Js::ParseableFunctionInfo::GetSourceName<SourceContextInfo*>
          (ParseableFunctionInfo *this,SourceContextInfo **sourceContextInfo)

{
  byte bVar1;
  SourceContextInfo *pSVar2;
  char16 *pcVar3;
  
  pSVar2 = *sourceContextInfo;
  if ((pSVar2->dwHostSourceContext == 0xffffffffffffffff) ||
     ((pSVar2->isHostDynamicDocument & 1U) != 0)) {
    bVar1 = (this->super_FunctionProxy).field_0x47;
    if ((bVar1 & 2) == 0) {
      pcVar3 = L"Unknown script code";
    }
    else {
      pcVar3 = L"Function code";
    }
    if ((bVar1 & 1) != 0) {
      pcVar3 = L"eval code";
    }
  }
  else {
    pcVar3 = (pSVar2->field_5).field_0.url;
  }
  return pcVar3;
}

Assistant:

LPCWSTR ParseableFunctionInfo::GetSourceName(const T& sourceContextInfo) const
    {
        return GetSourceName<T>(sourceContextInfo, this->m_isEval, this->m_isDynamicFunction);
    }